

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O0

int unz64local_getLong64(zlib_filefunc64_32_def *pzlib_filefunc_def,voidpf filestream,ZPOS64_T *pX)

{
  int local_30;
  int local_2c;
  int err;
  int i;
  ZPOS64_T x;
  ZPOS64_T *pX_local;
  voidpf filestream_local;
  zlib_filefunc64_32_def *pzlib_filefunc_def_local;
  
  local_2c = 0;
  x = (ZPOS64_T)pX;
  pX_local = (ZPOS64_T *)filestream;
  filestream_local = pzlib_filefunc_def;
  local_30 = unz64local_getByte(pzlib_filefunc_def,filestream,&local_2c);
  _err = (ulong)local_2c;
  if (local_30 == 0) {
    local_30 = unz64local_getByte((zlib_filefunc64_32_def *)filestream_local,pX_local,&local_2c);
  }
  _err = (long)local_2c << 8 | _err;
  if (local_30 == 0) {
    local_30 = unz64local_getByte((zlib_filefunc64_32_def *)filestream_local,pX_local,&local_2c);
  }
  _err = (long)local_2c << 0x10 | _err;
  if (local_30 == 0) {
    local_30 = unz64local_getByte((zlib_filefunc64_32_def *)filestream_local,pX_local,&local_2c);
  }
  _err = (long)local_2c << 0x18 | _err;
  if (local_30 == 0) {
    local_30 = unz64local_getByte((zlib_filefunc64_32_def *)filestream_local,pX_local,&local_2c);
  }
  _err = (long)local_2c << 0x20 | _err;
  if (local_30 == 0) {
    local_30 = unz64local_getByte((zlib_filefunc64_32_def *)filestream_local,pX_local,&local_2c);
  }
  _err = (long)local_2c << 0x28 | _err;
  if (local_30 == 0) {
    local_30 = unz64local_getByte((zlib_filefunc64_32_def *)filestream_local,pX_local,&local_2c);
  }
  _err = (long)local_2c << 0x30 | _err;
  if (local_30 == 0) {
    local_30 = unz64local_getByte((zlib_filefunc64_32_def *)filestream_local,pX_local,&local_2c);
  }
  if (local_30 == 0) {
    *(ulong *)x = (long)local_2c << 0x38 | _err;
  }
  else {
    *(undefined8 *)x = 0;
  }
  return local_30;
}

Assistant:

local int unz64local_getLong64(const zlib_filefunc64_32_def* pzlib_filefunc_def,
    voidpf filestream,
    ZPOS64_T* pX)
{
    ZPOS64_T x;
    int i = 0;
    int err;

    err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x = (ZPOS64_T)i;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 8;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 16;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 24;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 32;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 40;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 48;

    if (err == UNZ_OK)
        err = unz64local_getByte(pzlib_filefunc_def, filestream, &i);
    x |= ((ZPOS64_T)i) << 56;

    if (err == UNZ_OK)
        *pX = x;
    else
        *pX = 0;
    return err;
}